

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::rollback
          (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *this)

{
  pointer pSVar1;
  
  check_max(this);
  pSVar1 = (this->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  IStreamReader::set_pos
            (this->reader_,*(undefined8 *)(pSVar1 + -1),*(undefined8 *)&pSVar1[-1].field_0x8);
  pSVar1 = (this->stack_).
           super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->line_ = pSVar1[-1].line_;
  (this->stack_).
  super__Vector_base<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State,_std::allocator<jsonip::parser::ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::State>_>
  ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
  return;
}

Assistant:

inline void rollback()
        {
            check_max();
            reader_.set_pos(stack_.back().pos_);
            line_ = stack_.back().line_;
            stack_.pop_back();
        }